

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

path * boost::filesystem::detail::relative
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  bool bVar1;
  error_code tmp_ec;
  path wc_p;
  path wc_base;
  error_code local_78;
  path local_68;
  path local_48;
  
  local_78.m_val = 0;
  local_78.m_cat = system::system_category();
  weakly_canonical(&local_48,base,&local_78);
  bVar1 = anon_unknown.dwarf_54f5::error(local_78.m_val,base,ec,"boost::filesystem::relative");
  if (bVar1) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else {
    weakly_canonical(&local_68,p,&local_78);
    bVar1 = anon_unknown.dwarf_54f5::error(local_78.m_val,base,ec,"boost::filesystem::relative");
    if (bVar1) {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_pathname).field_2;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    }
    else {
      path::lexically_relative(__return_storage_ptr__,&local_68,&local_48);
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path relative(const path& p, const path& base, error_code* ec)
  {
    error_code tmp_ec;
    path wc_base(weakly_canonical(base, &tmp_ec));
    if (error(tmp_ec.value(), base, ec, "boost::filesystem::relative"))
      return path();
    path wc_p(weakly_canonical(p, &tmp_ec));
    if (error(tmp_ec.value(), base, ec, "boost::filesystem::relative"))
      return path();
    return wc_p.lexically_relative(wc_base);
  }